

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCodeAtInit(Parse *pParse,Expr *pExpr,int regDest)

{
  ExprList_item *pEVar1;
  int iVar2;
  Expr *pExpr_00;
  ExprList *pEVar3;
  long lVar4;
  anon_union_4_2_6146edf4_for_u *paVar5;
  int iVar6;
  
  pEVar3 = pParse->pConstExpr;
  if (pEVar3 != (ExprList *)0x0 && regDest < 0) {
    paVar5 = &pEVar3->a->u;
    for (iVar6 = pEVar3->nExpr; 0 < iVar6; iVar6 = iVar6 + -1) {
      if (((paVar5->iConstExprReg & 0x40000000000U) != 0) &&
         (iVar2 = sqlite3ExprCompare(((ExprList_item *)(paVar5 + -7))->pExpr,pExpr,-1), iVar2 == 0))
      {
        return paVar5->iConstExprReg;
      }
      paVar5 = paVar5 + 8;
    }
  }
  pExpr_00 = sqlite3ExprDup(pParse->db,pExpr,0);
  pEVar3 = sqlite3ExprListAppend(pParse,pEVar3,pExpr_00);
  if (pEVar3 != (ExprList *)0x0) {
    pEVar1 = pEVar3->a;
    lVar4 = (long)pEVar3->nExpr;
    pEVar1[lVar4 + -1].field_0x19 =
         pEVar1[lVar4 + -1].field_0x19 & 0xfb | (byte)((uint)regDest >> 0x1d) & 4;
    if (regDest < 0) {
      regDest = pParse->nMem + 1;
      pParse->nMem = regDest;
    }
    pEVar1[lVar4 + -1].u.iConstExprReg = regDest;
  }
  pParse->pConstExpr = pEVar3;
  return regDest;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeAtInit(
  Parse *pParse,    /* Parsing context */
  Expr *pExpr,      /* The expression to code when the VDBE initializes */
  int regDest       /* Store the value in this register */
){
  ExprList *p;
  assert( ConstFactorOk(pParse) );
  p = pParse->pConstExpr;
  if( regDest<0 && p ){
    struct ExprList_item *pItem;
    int i;
    for(pItem=p->a, i=p->nExpr; i>0; pItem++, i--){
      if( pItem->reusable && sqlite3ExprCompare(pItem->pExpr,pExpr,-1)==0 ){
        return pItem->u.iConstExprReg;
      }
    }
  }
  pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
  p = sqlite3ExprListAppend(pParse, p, pExpr);
  if( p ){
     struct ExprList_item *pItem = &p->a[p->nExpr-1];
     pItem->reusable = regDest<0;
     if( regDest<0 ) regDest = ++pParse->nMem;
     pItem->u.iConstExprReg = regDest;
  }
  pParse->pConstExpr = p;
  return regDest;
}